

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O3

void __thiscall
iutest::detail::ResultOfMatcher<int_(int),_iutest::detail::GtMatcher<int>_>::~ResultOfMatcher
          (ResultOfMatcher<int_(int),_iutest::detail::GtMatcher<int>_> *this)

{
  operator_delete(this,0x20);
  return;
}

Assistant:

class ResultOfMatcher IUTEST_CXX_FINAL : public IMatcher
{
public:
    ResultOfMatcher(F& func, const T& expected) : m_func(func), m_expected(expected) {}

public:
    template<typename U>
    AssertionResult operator ()(const U& actual)
    {
        if IUTEST_COND_LIKELY( Check(actual) )
        {
            return AssertionSuccess();
        }
        return AssertionFailure() << WhichIs();
    }

public:
    ::std::string WhichIs() const IUTEST_CXX_OVERRIDE
    {
        iu_global_format_stringstream strm;
        strm << "Result of: " << m_expected;
        //strm << "Result of " << detail::GetTypeNameProxy<F>::GetTypeName() << "(): " << m_expected;
        return strm.str();
    }